

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clearDualBounds(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,Status stat,
                 number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *upp,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *lw)

{
  double *pdVar1;
  long lVar2;
  uint uVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  byte bVar6;
  cpp_dec_float<200U,_int,_void> local_a0;
  
  bVar6 = 0;
  uVar3 = stat + D_ON_BOTH;
  if (uVar3 < 0xb) {
    if ((0x81U >> (uVar3 & 0x1f) & 1) == 0) {
      if ((0x104U >> (uVar3 & 0x1f) & 1) == 0) {
        if ((0x410U >> (uVar3 & 0x1f) & 1) == 0) {
          return;
        }
        pdVar1 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_a0,*pdVar1,(type *)0x0);
        pcVar4 = &local_a0;
        pnVar5 = upp;
        for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pnVar5->m_backend).data._M_elems[0] = (pcVar4->data)._M_elems[0];
          pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar6 * -8 + 4);
          pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar5 + ((ulong)bVar6 * -2 + 1) * 4);
        }
        (upp->m_backend).exp = local_a0.exp;
        (upp->m_backend).neg = local_a0.neg;
        (upp->m_backend).fpclass = local_a0.fpclass;
        (upp->m_backend).prec_elem = local_a0.prec_elem;
        return;
      }
      pdVar1 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_a0,-*pdVar1,(type *)0x0);
    }
    else {
      pdVar1 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_a0,*pdVar1,(type *)0x0);
      pcVar4 = &local_a0;
      pnVar5 = upp;
      for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pnVar5->m_backend).data._M_elems[0] = (pcVar4->data)._M_elems[0];
        pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar6 * -8 + 4);
        pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar5 + ((ulong)bVar6 * -2 + 1) * 4);
      }
      (upp->m_backend).exp = local_a0.exp;
      (upp->m_backend).neg = local_a0.neg;
      (upp->m_backend).fpclass = local_a0.fpclass;
      (upp->m_backend).prec_elem = local_a0.prec_elem;
      pdVar1 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_a0,-*pdVar1,(type *)0x0);
    }
    pcVar4 = &local_a0;
    pnVar5 = lw;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar5->m_backend).data._M_elems[0] = (pcVar4->data)._M_elems[0];
      pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + ((ulong)bVar6 * -2 + 1) * 4);
      pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar5 + ((ulong)bVar6 * -2 + 1) * 4);
    }
    (lw->m_backend).exp = local_a0.exp;
    (lw->m_backend).neg = local_a0.neg;
    (lw->m_backend).fpclass = local_a0.fpclass;
    (lw->m_backend).prec_elem = local_a0.prec_elem;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::clearDualBounds(
   typename SPxBasisBase<R>::Desc::Status stat,
   R&                  upp,
   R&                  lw) const
{

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_FREE :
      upp = R(infinity);
      lw  = R(-infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
   case SPxBasisBase<R>::Desc::D_ON_LOWER :
      upp = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_ON_UPPER :
      lw  = R(-infinity);
      break;

   default:
      break;
   }
}